

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O3

void __thiscall Memory::HeapInfo::VerifyMark(HeapInfo *this)

{
  SmallHeapBlockT<SmallAllocationBlockAttributes> *pSVar1;
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *this_00;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *pSVar2;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *this_01;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *heapBlock_9;
  SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *heapBlock;
  long lVar3;
  
  lVar3 = 0x78;
  do {
    HeapBucketGroup<SmallAllocationBlockAttributes>::VerifyMark
              ((HeapBucketGroup<SmallAllocationBlockAttributes> *)
               ((long)&((HeapInfo *)(&this->smallBlockPageHeapBucketFilter + -0xc))->recycler +
               lVar3));
    lVar3 = lVar3 + 0x380;
  } while (lVar3 != 0xa878);
  lVar3 = 0;
  do {
    HeapBucketGroup<MediumAllocationBlockAttributes>::VerifyMark
              ((HeapBucketGroup<MediumAllocationBlockAttributes> *)
               ((long)&this->mediumHeapBuckets[0].heapBucket.
                       super_SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
                       .
                       super_HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
                       .super_HeapBucket.heapInfo + lVar3));
    lVar3 = lVar3 + 0x380;
  } while (lVar3 != 0x6580);
  LargeHeapBucket::VerifyMark(&this->largeObjectBucket);
  for (pSVar1 = &this->newLeafHeapBlockList->super_SmallHeapBlockT<SmallAllocationBlockAttributes>;
      pSVar1 != (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
      pSVar1 = &HeapBlock::AsLeafBlock<SmallAllocationBlockAttributes>
                          (&pSVar1->next->super_HeapBlock)->
                super_SmallHeapBlockT<SmallAllocationBlockAttributes>) {
    SmallHeapBlockT<SmallAllocationBlockAttributes>::VerifyMark(pSVar1);
    if (pSVar1->next == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) break;
  }
  for (pSVar1 = &this->newNormalHeapBlockList->super_SmallHeapBlockT<SmallAllocationBlockAttributes>
      ; pSVar1 != (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
      pSVar1 = &HeapBlock::AsNormalBlock<SmallAllocationBlockAttributes>
                          (&pSVar1->next->super_HeapBlock)->
                super_SmallHeapBlockT<SmallAllocationBlockAttributes>) {
    SmallHeapBlockT<SmallAllocationBlockAttributes>::VerifyMark(pSVar1);
    if (pSVar1->next == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) break;
  }
  for (pSVar1 = (SmallHeapBlockT<SmallAllocationBlockAttributes> *)
                this->newNormalWithBarrierHeapBlockList;
      pSVar1 != (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
      pSVar1 = (SmallHeapBlockT<SmallAllocationBlockAttributes> *)
               HeapBlock::AsNormalWriteBarrierBlock<SmallAllocationBlockAttributes>
                         (&pSVar1->next->super_HeapBlock)) {
    SmallHeapBlockT<SmallAllocationBlockAttributes>::VerifyMark(pSVar1);
    if (pSVar1->next == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) break;
  }
  for (pSVar1 = (SmallHeapBlockT<SmallAllocationBlockAttributes> *)
                this->newFinalizableWithBarrierHeapBlockList;
      pSVar1 != (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
      pSVar1 = (SmallHeapBlockT<SmallAllocationBlockAttributes> *)
               HeapBlock::AsFinalizableWriteBarrierBlock<SmallAllocationBlockAttributes>
                         (&pSVar1->next->super_HeapBlock)) {
    SmallHeapBlockT<SmallAllocationBlockAttributes>::VerifyMark(pSVar1);
    if (pSVar1->next == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) break;
  }
  this_00 = this->newFinalizableHeapBlockList;
  while (this_00 != (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    SmallHeapBlockT<SmallAllocationBlockAttributes>::VerifyMark
              ((SmallHeapBlockT<SmallAllocationBlockAttributes> *)this_00);
    pSVar1 = (this_00->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
             super_SmallHeapBlockT<SmallAllocationBlockAttributes>.next;
    if (pSVar1 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) break;
    this_00 = HeapBlock::AsFinalizableBlock<SmallAllocationBlockAttributes>
                        (&pSVar1->super_HeapBlock);
  }
  for (pSVar2 = &this->newMediumLeafHeapBlockList->
                 super_SmallHeapBlockT<MediumAllocationBlockAttributes>;
      pSVar2 != (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
      pSVar2 = &HeapBlock::AsLeafBlock<MediumAllocationBlockAttributes>
                          (&pSVar2->next->super_HeapBlock)->
                super_SmallHeapBlockT<MediumAllocationBlockAttributes>) {
    SmallHeapBlockT<MediumAllocationBlockAttributes>::VerifyMark(pSVar2);
    if (pSVar2->next == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) break;
  }
  for (pSVar2 = &this->newMediumNormalHeapBlockList->
                 super_SmallHeapBlockT<MediumAllocationBlockAttributes>;
      pSVar2 != (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
      pSVar2 = &HeapBlock::AsNormalBlock<MediumAllocationBlockAttributes>
                          (&pSVar2->next->super_HeapBlock)->
                super_SmallHeapBlockT<MediumAllocationBlockAttributes>) {
    SmallHeapBlockT<MediumAllocationBlockAttributes>::VerifyMark(pSVar2);
    if (pSVar2->next == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) break;
  }
  for (pSVar2 = (SmallHeapBlockT<MediumAllocationBlockAttributes> *)
                this->newMediumNormalWithBarrierHeapBlockList;
      pSVar2 != (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
      pSVar2 = (SmallHeapBlockT<MediumAllocationBlockAttributes> *)
               HeapBlock::AsNormalWriteBarrierBlock<MediumAllocationBlockAttributes>
                         (&pSVar2->next->super_HeapBlock)) {
    SmallHeapBlockT<MediumAllocationBlockAttributes>::VerifyMark(pSVar2);
    if (pSVar2->next == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) break;
  }
  for (pSVar2 = (SmallHeapBlockT<MediumAllocationBlockAttributes> *)
                this->newMediumFinalizableWithBarrierHeapBlockList;
      pSVar2 != (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
      pSVar2 = (SmallHeapBlockT<MediumAllocationBlockAttributes> *)
               HeapBlock::AsFinalizableWriteBarrierBlock<MediumAllocationBlockAttributes>
                         (&pSVar2->next->super_HeapBlock)) {
    SmallHeapBlockT<MediumAllocationBlockAttributes>::VerifyMark(pSVar2);
    if (pSVar2->next == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) break;
  }
  this_01 = this->newMediumFinalizableHeapBlockList;
  while( true ) {
    if (this_01 == (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      return;
    }
    SmallHeapBlockT<MediumAllocationBlockAttributes>::VerifyMark
              ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)this_01);
    pSVar2 = (this_01->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
             super_SmallHeapBlockT<MediumAllocationBlockAttributes>.next;
    if (pSVar2 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) break;
    this_01 = HeapBlock::AsFinalizableBlock<MediumAllocationBlockAttributes>
                        (&pSVar2->super_HeapBlock);
  }
  return;
}

Assistant:

void
HeapInfo::VerifyMark()
{
    for (uint i = 0; i < HeapConstants::BucketCount; i++)
    {
        heapBuckets[i].VerifyMark();
    }

#ifdef BUCKETIZE_MEDIUM_ALLOCATIONS
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
        mediumHeapBuckets[i].VerifyMark();
    }
#endif

    largeObjectBucket.VerifyMark();

#if ENABLE_CONCURRENT_GC
    HeapBlockList::ForEach(newLeafHeapBlockList, [](SmallLeafHeapBlock * heapBlock)
    {
        heapBlock->VerifyMark();
    });
    HeapBlockList::ForEach(newNormalHeapBlockList, [](SmallNormalHeapBlock * heapBlock)
    {
        heapBlock->VerifyMark();
    });
#ifdef RECYCLER_WRITE_BARRIER
    HeapBlockList::ForEach(newNormalWithBarrierHeapBlockList, [](SmallNormalWithBarrierHeapBlock * heapBlock)
    {
        heapBlock->VerifyMark();
    });
    HeapBlockList::ForEach(newFinalizableWithBarrierHeapBlockList, [](SmallFinalizableWithBarrierHeapBlock * heapBlock)
    {
        heapBlock->VerifyMark();
    });
#endif
#ifdef RECYCLER_VISITED_HOST
    HeapBlockList::ForEach(newRecyclerVisitedHostHeapBlockList, [](SmallFinalizableHeapBlock * heapBlock)
    {
        heapBlock->VerifyMark();
    });
#endif
    HeapBlockList::ForEach(newFinalizableHeapBlockList, [](SmallFinalizableHeapBlock * heapBlock)
    {
        heapBlock->VerifyMark();
    });
#endif

#if ENABLE_CONCURRENT_GC
    HeapBlockList::ForEach(newMediumLeafHeapBlockList, [](MediumLeafHeapBlock * heapBlock)
    {
        heapBlock->VerifyMark();
    });
    HeapBlockList::ForEach(newMediumNormalHeapBlockList, [](MediumNormalHeapBlock * heapBlock)
    {
        heapBlock->VerifyMark();
    });
#ifdef RECYCLER_WRITE_BARRIER
    HeapBlockList::ForEach(newMediumNormalWithBarrierHeapBlockList, [](MediumNormalWithBarrierHeapBlock * heapBlock)
    {
        heapBlock->VerifyMark();
    });
    HeapBlockList::ForEach(newMediumFinalizableWithBarrierHeapBlockList, [](MediumFinalizableWithBarrierHeapBlock * heapBlock)
    {
        heapBlock->VerifyMark();
    });
#endif
#ifdef RECYCLER_VISITED_HOST
    HeapBlockList::ForEach(newMediumRecyclerVisitedHostHeapBlockList, [](MediumFinalizableHeapBlock * heapBlock)
    {
        heapBlock->VerifyMark();
    });
#endif
    HeapBlockList::ForEach(newMediumFinalizableHeapBlockList, [](MediumFinalizableHeapBlock * heapBlock)
    {
        heapBlock->VerifyMark();
    });
#endif
}